

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-server.c
# Opt level: O0

void sighandler(int sig)

{
  int sig_local;
  
  if (sig == 10) {
    dynamic_vhost_enable = dynamic_vhost_enable ^ 1;
    lws_cancel_service(context);
    _lws_log(4,"SIGUSR1: dynamic_vhost_enable: %d\n",(ulong)(uint)dynamic_vhost_enable);
  }
  else {
    force_exit = 1;
    lws_cancel_service(context);
  }
  return;
}

Assistant:

void sighandler(int sig)
{
#if !defined(WIN32) && !defined(_WIN32)
	/* because windows is too dumb to have SIGUSR1... */
	if (sig == SIGUSR1) {
		/*
		 * For testing, you can fire a SIGUSR1 at the test server
		 * to toggle the existence of an identical server on
		 * port + 1
		 */
		dynamic_vhost_enable ^= 1;
		lws_cancel_service(context);
		lwsl_notice("SIGUSR1: dynamic_vhost_enable: %d\n",
				dynamic_vhost_enable);
		return;
	}
#endif
	force_exit = 1;
	lws_cancel_service(context);
}